

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

void * CallbackThreadFunc(void *userData)

{
  int iVar1;
  int iVar2;
  pthread_t pVar3;
  PaAlsaStream *in_RDI;
  PaError *pres;
  int xrun;
  unsigned_long framesGot;
  unsigned_long framesAvail;
  int __pa_unsure_error_id_1;
  int __pa_unsure_error_id;
  snd_pcm_sframes_t avail;
  int __not_first_call;
  void *__cancel_arg;
  PaStreamFinishedCallback *__cancel_routine;
  __pthread_unwind_buf_t __cancel_buf;
  int streamStarted;
  PaStreamCallbackFlags cbFlags;
  int callbackResult;
  snd_pcm_sframes_t startThreshold;
  PaStreamCallbackTimeInfo timeInfo;
  PaAlsaStream *stream;
  PaError result;
  long in_stack_fffffffffffffed8;
  PaAlsaStream *in_stack_fffffffffffffee0;
  PaHostApiTypeId PVar4;
  unsigned_long in_stack_fffffffffffffee8;
  PaAlsaStream *in_stack_fffffffffffffef0;
  int *local_100;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar5;
  PaAlsaStream *numFrames;
  PaAlsaStream *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  PaAlsaStream *streamCallbackResult;
  code *bp;
  unsigned_long *in_stack_ffffffffffffff48;
  PaAlsaStream *in_stack_ffffffffffffff50;
  ulong local_48;
  int local_3c;
  PaStreamCallbackTimeInfo local_30;
  PaAlsaStream *local_18;
  PaError local_c;
  
  local_c = 0;
  local_18 = in_RDI;
  memset(&local_30,0,0x18);
  local_3c = 0;
  bp = OnExit;
  streamCallbackResult = local_18;
  iVar1 = __sigsetjmp(&stack0xffffffffffffff48,0);
  if (iVar1 != 0) {
    (*bp)(streamCallbackResult);
    __pthread_unwind_next((__pthread_unwind_buf_t *)&stack0xffffffffffffff48);
  }
  __pthread_register_cancel((__pthread_unwind_buf_t *)&stack0xffffffffffffff48);
  pthread_testcancel();
  pthread_setcancelstate(1,(int *)0x0);
  if (local_18->primeBuffers == 0) {
    paUtilErr_ = PaUnixThread_PrepareNotify((PaUnixThread *)in_stack_fffffffffffffee0);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaUnixThread_PrepareNotify( &stream->thread )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4226\n"
                       );
      local_c = paUtilErr_;
      goto LAB_0011c516;
    }
    paUtilErr_ = AlsaStart((PaAlsaStream *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'AlsaStart( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4228\n"
                       );
      local_c = paUtilErr_;
      goto LAB_0011c516;
    }
    paUtilErr_ = PaUnixThread_NotifyParent((PaUnixThread *)in_stack_fffffffffffffee0);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaUnixThread_NotifyParent( &stream->thread )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4229\n"
                       );
      local_c = paUtilErr_;
      goto LAB_0011c516;
    }
  }
  else {
    if (((local_18->playback).pcm != (snd_pcm_t *)0x0) &&
       (iVar1 = (*(code *)alsa_snd_pcm_prepare)((local_18->playback).pcm), iVar1 < 0)) {
      pVar3 = pthread_self();
      PVar4 = (PaHostApiTypeId)((ulong)in_stack_fffffffffffffee0 >> 0x20);
      iVar2 = pthread_equal(pVar3,paUnixMainThread);
      if (iVar2 != 0) {
        (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(PVar4,in_stack_fffffffffffffed8,(char *)0x11bee4);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_prepare( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4214\n"
                       );
      local_c = -9999;
      goto LAB_0011c516;
    }
    if ((((local_18->capture).pcm != (snd_pcm_t *)0x0) && (local_18->pcmsSynced == 0)) &&
       (iVar1 = (*(code *)alsa_snd_pcm_prepare)((local_18->capture).pcm), iVar1 < 0)) {
      pVar3 = pthread_self();
      PVar4 = (PaHostApiTypeId)((ulong)in_stack_fffffffffffffee0 >> 0x20);
      iVar2 = pthread_equal(pVar3,paUnixMainThread);
      if (iVar2 != 0) {
        (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(PVar4,in_stack_fffffffffffffed8,(char *)0x11bfa7);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_prepare( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4216\n"
                       );
      local_c = -9999;
      goto LAB_0011c516;
    }
    in_stack_fffffffffffffee8 = (*alsa_snd_pcm_avail_update)((local_18->playback).pcm);
  }
LAB_0011c116:
  iVar2 = 0;
  pthread_testcancel();
  iVar1 = PaUnixThread_StopRequested(&local_18->thread);
  if ((iVar1 != 0) && (local_3c == 0)) {
    local_3c = 1;
  }
  if ((local_3c != 0) &&
     ((local_18->callbackAbort = (uint)(local_3c == 2), local_18->callbackAbort != 0 ||
      (iVar1 = PaUtil_IsBufferProcessorOutputEmpty(&local_18->bufferProcessor), iVar1 != 0))))
  goto LAB_0011c516;
  paUtilErr_ = PaAlsaStream_WaitForFrames
                         (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(int *)bp);
  if (-1 < paUtilErr_) {
    if (iVar2 == 0) {
      while (local_48 = 0, in_stack_ffffffffffffff18 != (PaAlsaStream *)0x0) {
        uVar5 = 0;
        if (0.0 < local_18->underrun) {
          local_48 = 4;
          local_18->underrun = 0.0;
        }
        if (0.0 < local_18->overrun) {
          local_48 = local_48 | 2;
          local_18->overrun = 0.0;
        }
        if (((local_18->capture).pcm != (snd_pcm_t *)0x0) &&
           ((local_18->playback).pcm != (snd_pcm_t *)0x0)) {
          if ((local_18->capture).ready == 0) {
            local_48 = local_48 | 1;
          }
          else if ((local_18->playback).ready == 0) {
            local_48 = local_48 | 8;
          }
        }
        CalculateTimeInfo(local_18,&local_30);
        PaUtil_BeginBufferProcessing(&local_18->bufferProcessor,&local_30,local_48);
        PaUtil_BeginCpuLoadMeasurement((PaUtilCpuLoadMeasurer *)0x11c36c);
        if ((local_18->bufferProcessor).hostBufferSizeMode == paUtilFixedHostBufferSize) {
          if (in_stack_ffffffffffffff18 < (PaAlsaStream *)local_18->maxFramesPerHostBuffer) {
            in_stack_fffffffffffffee0 = (PaAlsaStream *)0x0;
            numFrames = in_stack_fffffffffffffee0;
          }
          else {
            in_stack_fffffffffffffee0 = (PaAlsaStream *)local_18->maxFramesPerHostBuffer;
            numFrames = in_stack_fffffffffffffee0;
          }
        }
        else {
          numFrames = in_stack_ffffffffffffff18;
          if ((PaAlsaStream *)local_18->maxFramesPerHostBuffer <= in_stack_ffffffffffffff18) {
            numFrames = (PaAlsaStream *)local_18->maxFramesPerHostBuffer;
          }
        }
        paUtilErr_ = PaAlsaStream_SetUpBuffers
                               (in_stack_ffffffffffffff18,(unsigned_long *)numFrames,
                                (int *)CONCAT44(uVar5,in_stack_ffffffffffffff08));
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4339\n"
                           );
          local_c = paUtilErr_;
          goto LAB_0011c516;
        }
        in_stack_ffffffffffffff18 =
             (PaAlsaStream *)((long)in_stack_ffffffffffffff18 - (long)numFrames);
        if (numFrames != (PaAlsaStream *)0x0) {
          PaUtil_EndBufferProcessing((PaUtilBufferProcessor *)bp,(int *)streamCallbackResult);
          paUtilErr_ = PaAlsaStream_EndProcessing
                                 (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                                  (int *)in_stack_fffffffffffffee0);
          if (paUtilErr_ < 0) {
            PaUtil_DebugPrint(
                             "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4347\n"
                             );
            local_c = paUtilErr_;
            goto LAB_0011c516;
          }
        }
        PaUtil_EndCpuLoadMeasurement
                  ((PaUtilCpuLoadMeasurer *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        if ((numFrames == (PaAlsaStream *)0x0) || (local_3c != 0)) break;
      }
    }
    goto LAB_0011c116;
  }
  PaUtil_DebugPrint(
                   "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4269\n"
                   );
  local_c = paUtilErr_;
LAB_0011c516:
  __pthread_unregister_cancel((__pthread_unwind_buf_t *)&stack0xffffffffffffff48);
  (*bp)(streamCallbackResult);
  local_100 = (int *)0x0;
  if (local_c != 0) {
    local_100 = (int *)malloc(4);
    *local_100 = local_c;
  }
  pthread_exit(local_100);
}

Assistant:

static void *CallbackThreadFunc( void *userData )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*) userData;
    PaStreamCallbackTimeInfo timeInfo = {0, 0, 0};
    snd_pcm_sframes_t startThreshold = 0;
    int callbackResult = paContinue;
    PaStreamCallbackFlags cbFlags = 0;  /* We might want to keep state across iterations */
    int streamStarted = 0;

    assert( stream );
    /* Not implemented */
    assert( !stream->primeBuffers );

    /* Execute OnExit when exiting */
    pthread_cleanup_push( &OnExit, stream );
#ifdef PTHREAD_CANCELED
    /* 'Abort' will use thread cancellation to terminate the callback thread, but the Alsa-lib functions
     * are NOT cancel-safe, (and can end up in an inconsistent state).  So, disable cancelability for
     * the thread here, and just re-enable it for the poll() in PaAlsaStream_WaitForFrames(). */
    pthread_testcancel();
    pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, NULL );
#endif

    /* @concern StreamStart If the output is being primed the output pcm needs to be prepared, otherwise the
     * stream is started immediately. The latter involves signaling the waiting main thread.
     */
    if( stream->primeBuffers )
    {
        snd_pcm_sframes_t avail;

        if( stream->playback.pcm )
            ENSURE_( alsa_snd_pcm_prepare( stream->playback.pcm ), paUnanticipatedHostError );
        if( stream->capture.pcm && !stream->pcmsSynced )
            ENSURE_( alsa_snd_pcm_prepare( stream->capture.pcm ), paUnanticipatedHostError );

        /* We can't be certain that the whole ring buffer is available for priming, but there should be
         * at least one period */
        avail = alsa_snd_pcm_avail_update( stream->playback.pcm );
        startThreshold = avail - (avail % stream->playback.framesPerPeriod);
        assert( startThreshold >= stream->playback.framesPerPeriod );
    }
    else
    {
        PA_ENSURE( PaUnixThread_PrepareNotify( &stream->thread ) );
        /* Buffer will be zeroed */
        PA_ENSURE( AlsaStart( stream, 0 ) );
        PA_ENSURE( PaUnixThread_NotifyParent( &stream->thread ) );

        streamStarted = 1;
    }

    while( 1 )
    {
        unsigned long framesAvail, framesGot;
        int xrun = 0;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif

        /* @concern StreamStop if the main thread has requested a stop and the stream has not been effectively
         * stopped we signal this condition by modifying callbackResult (we'll want to flush buffered output).
         */
        if( PaUnixThread_StopRequested( &stream->thread ) && paContinue == callbackResult )
        {
            PA_DEBUG(( "Setting callbackResult to paComplete\n" ));
            callbackResult = paComplete;
        }

        if( paContinue != callbackResult )
        {
            stream->callbackAbort = ( paAbort == callbackResult );
            if( stream->callbackAbort ||
                    /** @concern BlockAdaption: Go on if adaption buffers are empty */
                    PaUtil_IsBufferProcessorOutputEmpty( &stream->bufferProcessor ) )
            {
                goto end;
            }

            PA_DEBUG(( "%s: Flushing buffer processor\n", __FUNCTION__ ));
            /* There is still buffered output that needs to be processed */
        }

        /* Wait for data to become available, this comes down to polling the ALSA file descriptors untill we have
         * a number of available frames.
         */
        PA_ENSURE( PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun ) );
        if( xrun )
        {
            assert( 0 == framesAvail );
            continue;

            /* XXX: Report xruns to the user? A situation is conceivable where the callback is never invoked due
             * to constant xruns, it might be desirable to notify the user of this.
             */
        }

        /* Consume buffer space. Once we have a number of frames available for consumption we must retrieve the
         * mmapped buffers from ALSA, this is contiguously accessible memory however, so we may receive smaller
         * portions at a time than is available as a whole. Therefore we should be prepared to process several
         * chunks successively. The buffers are passed to the PA buffer processor.
         */
        while( framesAvail > 0 )
        {
            xrun = 0;

            /** @concern Xruns Under/overflows are to be reported to the callback */
            if( stream->underrun > 0.0 )
            {
                cbFlags |= paOutputUnderflow;
                stream->underrun = 0.0;
            }
            if( stream->overrun > 0.0 )
            {
                cbFlags |= paInputOverflow;
                stream->overrun = 0.0;
            }
            if( stream->capture.pcm && stream->playback.pcm )
            {
                /** @concern FullDuplex It's possible that only one direction is being processed to avoid an
                 * under- or overflow, this should be reported correspondingly */
                if( !stream->capture.ready )
                {
                    cbFlags |= paInputUnderflow;
                    PA_DEBUG(( "%s: Input underflow\n", __FUNCTION__ ));
                }
                else if( !stream->playback.ready )
                {
                    cbFlags |= paOutputOverflow;
                    PA_DEBUG(( "%s: Output overflow\n", __FUNCTION__ ));
                }
            }

#if 0
            CallbackUpdate( &stream->threading );
#endif

            CalculateTimeInfo( stream, &timeInfo );
            PaUtil_BeginBufferProcessing( &stream->bufferProcessor, &timeInfo, cbFlags );
            cbFlags = 0;

            /* CPU load measurement should include processing activity external to the stream callback */
            PaUtil_BeginCpuLoadMeasurement( &stream->cpuLoadMeasurer );

            framesGot = framesAvail;
            if( paUtilFixedHostBufferSize == stream->bufferProcessor.hostBufferSizeMode )
            {
                /* We've committed to a fixed host buffer size, stick to that */
                framesGot = framesGot >= stream->maxFramesPerHostBuffer ? stream->maxFramesPerHostBuffer : 0;
            }
            else
            {
                /* We've committed to an upper bound on the size of host buffers */
                assert( paUtilBoundedHostBufferSize == stream->bufferProcessor.hostBufferSizeMode );
                framesGot = PA_MIN( framesGot, stream->maxFramesPerHostBuffer );
            }
            PA_ENSURE( PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun ) );
            /* Check the host buffer size against the buffer processor configuration */
            framesAvail -= framesGot;

            if( framesGot > 0 )
            {
                assert( !xrun );
                PaUtil_EndBufferProcessing( &stream->bufferProcessor, &callbackResult );
                PA_ENSURE( PaAlsaStream_EndProcessing( stream, framesGot, &xrun ) );
            }
            PaUtil_EndCpuLoadMeasurement( &stream->cpuLoadMeasurer, framesGot );

            if( 0 == framesGot )
            {
                /* Go back to polling for more frames */
                break;
            }

            if( paContinue != callbackResult )
                break;
        }
    }

end:
    ; /* Hack to fix "label at end of compound statement" error caused by pthread_cleanup_pop(1) macro. */
    /* Match pthread_cleanup_push */
    pthread_cleanup_pop( 1 );

    PA_DEBUG(( "%s: Thread %d exiting\n ", __FUNCTION__, pthread_self() ));
    PaUnixThreading_EXIT( result );

error:
    PA_DEBUG(( "%s: Thread %d is canceled due to error %d\n ", __FUNCTION__, pthread_self(), result ));
    goto end;
}